

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

MDOperand * __thiscall
LLVMBC::ModuleParseContext::get_metadata(ModuleParseContext *this,uint64_t index)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_false> local_28;
  const_iterator itr;
  uint64_t index_local;
  ModuleParseContext *this_local;
  
  itr.super__Node_iterator_base<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_false>)index;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_LLVMBC::MDOperand_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>_>
       ::find(&this->metadata,(key_type *)&itr);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_LLVMBC::MDOperand_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>_>
       ::end(&this->metadata);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_false,_false>
                           *)&local_28);
    this_local = (ModuleParseContext *)pvVar2->second;
  }
  else {
    this_local = (ModuleParseContext *)
                 LLVMContext::construct<LLVMBC::MDOperand,LLVMBC::Module*const&>
                           (this->context,&this->module);
  }
  return (MDOperand *)this_local;
}

Assistant:

MDOperand *ModuleParseContext::get_metadata(uint64_t index) const
{
	auto itr = metadata.find(index);
	if (itr != metadata.end())
		return itr->second;
	else
	{
		// Need to return a null-node like this since MDOperand is used as a reference in the LLVM API for some reason.
		return context->construct<MDOperand>(module);
	}
}